

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-sched.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  void *pvVar1;
  pointer piVar2;
  pointer ppgVar3;
  pointer ppgVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  time_t tVar8;
  long lVar9;
  ggml_cgraph *pgVar10;
  undefined8 uVar11;
  id *piVar12;
  mapped_type *pmVar13;
  size_t __i;
  long lVar14;
  pointer ppgVar15;
  pointer ppgVar16;
  ulong uVar17;
  ulong uVar18;
  pointer piVar19;
  undefined4 uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  id id;
  vector<int,_std::allocator<int>_> embd;
  vector<int,_std::allocator<int>_> embd_inp;
  vector<float,_std::allocator<float>_> logits;
  gpt_params params;
  gpt_vocab vocab;
  mt19937 rng;
  float local_1660;
  key_type local_165c;
  vector<int,_std::allocator<int>_> local_1658;
  vector<int,_std::allocator<int>_> local_1640;
  undefined8 local_1628;
  long local_1620;
  vector<float,_std::allocator<float>_> local_1618;
  undefined8 local_1600;
  ggml_backend_sched_t local_15f8;
  float local_15f0;
  float local_15ec;
  long local_15e8;
  long local_15e0;
  long local_15d8;
  long local_15d0;
  undefined1 local_15c8 [88];
  string local_1570;
  string local_1550;
  undefined1 local_1528 [72];
  pointer local_14e0;
  pointer pgStack_14d8;
  pointer local_14d0;
  ggml_context *local_14b8;
  pointer local_14b0;
  pointer ppgStack_14a8;
  pointer local_14a0;
  pointer ppgStack_1498;
  pointer local_1490;
  pointer ppgStack_1488;
  ggml_backend_buffer_t local_1480;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
  local_1470;
  gpt_vocab local_1430;
  mt19937 local_13b8;
  
  ggml_time_init();
  lVar7 = ggml_time_us();
  gpt_params::gpt_params((gpt_params *)local_15c8);
  std::__cxx11::string::_M_replace((ulong)(local_15c8 + 0x38),0,(char *)local_15c8._64_8_,0x122633);
  bVar5 = gpt_params_parse(argc,argv,(gpt_params *)local_15c8);
  iVar6 = 1;
  if (bVar5) {
    if ((int)local_15c8._0_4_ < 0) {
      tVar8 = time((time_t *)0x0);
      local_15c8._0_4_ = (undefined4)tVar8;
    }
    printf("%s: seed = %d\n","main");
    local_13b8._M_x[0] = (unsigned_long)(uint)local_15c8._0_4_;
    lVar14 = 1;
    uVar17 = local_13b8._M_x[0];
    do {
      uVar17 = (ulong)(((uint)(uVar17 >> 0x1e) ^ (uint)uVar17) * 0x6c078965 + (int)lVar14);
      local_13b8._M_x[lVar14] = uVar17;
      lVar14 = lVar14 + 1;
    } while (lVar14 != 0x270);
    local_13b8._M_p = 0x270;
    if (local_1570._M_string_length == 0) {
      gpt_random_prompt_abi_cxx11_((string *)local_1528,&local_13b8);
      std::__cxx11::string::operator=((string *)(local_15c8 + 0x58),(string *)local_1528);
      if ((undefined1 *)local_1528._0_8_ != local_1528 + 0x10) {
        operator_delete((void *)local_1528._0_8_,local_1528._16_8_ + 1);
      }
    }
    local_1430.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1430.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header;
    local_1430.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1430.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1430.token_to_id._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1430.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1430.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header;
    local_1430.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1430.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1430.id_to_token._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1430.special_tokens.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1430.special_tokens.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1430.special_tokens.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1470._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1470._M_impl.super__Rb_tree_header._M_header;
    local_1528._0_8_ = (pointer)0x4000000c451;
    local_1528._8_8_ = 0xc00000300;
    local_1528._16_8_ = 0x10000000c;
    local_1528._24_4_ = 0x3727c5ac;
    local_14e0 = (pointer)0x0;
    pgStack_14d8 = (pointer)0x0;
    local_14d0 = (pointer)0x0;
    local_1470._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1470._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_14b0 = (pointer)0x0;
    ppgStack_14a8 = (pointer)0x0;
    local_14a0 = (pointer)0x0;
    ppgStack_1498 = (pointer)0x0;
    local_1490 = (pointer)0x0;
    ppgStack_1488 = (pointer)0x0;
    local_1470._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1470._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1470._M_impl.super__Rb_tree_header._M_header._M_left;
    local_1430.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1430.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_1430.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1430.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    lVar14 = ggml_time_us();
    bVar5 = gpt2_model_load((string *)(local_15c8 + 0x38),(gpt2_model *)local_1528,&local_1430,
                            (gpt_params *)local_15c8);
    if (bVar5) {
      lVar9 = ggml_time_us();
      test_gpt_tokenizer(&local_1430,(string *)(local_15c8 + 0x78));
      local_15d8 = lVar9;
      local_15f8 = (ggml_backend_sched_t)
                   ggml_backend_sched_new
                             (local_14b0,0,(ulong)((long)ppgStack_14a8 - (long)local_14b0) >> 3,
                              0x1000,0);
      uVar20 = local_1528._4_4_;
      iVar6 = local_15c8._16_4_;
      if ((int)local_1528._4_4_ <= (int)local_15c8._16_4_) {
        iVar6 = local_1528._4_4_;
      }
      local_1640.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = 0;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_1618,(long)iVar6,
                 (value_type_conflict3 *)&local_1640,(allocator_type *)&local_1658);
      pgVar10 = gpt2_graph((gpt2_model *)local_1528,uVar20 - iVar6,
                           (vector<int,_std::allocator<int>_> *)&local_1618);
      if (local_1618.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1618.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1618.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1618.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      ggml_backend_sched_reserve(local_15f8,pgVar10);
      local_15e0 = lVar14;
      if (ppgStack_14a8 == local_14b0) {
        uVar20 = 0;
      }
      else {
        lVar14 = 0;
        uVar17 = 0;
        do {
          lVar9 = ggml_backend_sched_get_buffer_size(local_15f8,local_14b0[uVar17]);
          if (lVar9 != 0) {
            uVar11 = ggml_backend_name(local_14b0[uVar17]);
            lVar14 = lVar14 + lVar9;
            auVar21._8_4_ = (int)((ulong)lVar9 >> 0x20);
            auVar21._0_8_ = lVar9;
            auVar21._12_4_ = 0x45300000;
            printf("%s: %8s compute buffer size = %8.2f MB\n",
                   SUB84(((auVar21._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)) *
                         0.0009765625 * 0.0009765625,0),"main",uVar11);
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 < (ulong)((long)ppgStack_14a8 - (long)local_14b0 >> 3));
        auVar22._8_4_ = (int)((ulong)lVar14 >> 0x20);
        auVar22._0_8_ = lVar14;
        auVar22._12_4_ = 0x45300000;
        uVar20 = SUB84(((auVar22._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar14) - 4503599627370496.0)) *
                       0.0009765625 * 0.0009765625,0);
      }
      printf("%s: total compute buffer size: %.2f MB\n",uVar20,"main");
      local_1618.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_1618.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_1618.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      gpt_tokenize(&local_1640,&local_1430,(string *)(local_15c8 + 0x58));
      iVar6 = local_1528._4_4_ -
              (int)((ulong)((long)local_1640.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           CONCAT44(local_1640.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                    .super__Vector_impl_data._M_start._4_4_,
                                    local_1640.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                    .super__Vector_impl_data._M_start._0_4_)) >> 2);
      if ((int)local_15c8._8_4_ <= iVar6) {
        iVar6 = local_15c8._8_4_;
      }
      local_15c8._8_4_ = iVar6;
      printf("%s: prompt: \'%s\'\n","main",local_1570._M_dataplus._M_p);
      printf("%s: number of tokens in prompt = %zu, first 8 tokens: ","main",
             (long)local_1640.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             CONCAT44(local_1640.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start._4_4_,
                      local_1640.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start._0_4_) >> 2);
      lVar14 = CONCAT44(local_1640.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_,
                        local_1640.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start._0_4_);
      if (0 < (int)((ulong)((long)local_1640.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish - lVar14) >> 2)) {
        lVar9 = 0;
        do {
          printf("%d ",(ulong)*(uint *)(lVar14 + lVar9 * 4));
          lVar9 = lVar9 + 1;
          lVar14 = CONCAT44(local_1640.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            local_1640.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_);
          iVar6 = (int)((ulong)((long)local_1640.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_finish - lVar14) >> 2);
          if (7 < iVar6) {
            iVar6 = 8;
          }
        } while (lVar9 < iVar6);
      }
      puts("\n");
      local_1658.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (id *)0x0;
      local_1658.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (id *)0x0;
      local_1658.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (int *)0x0;
      local_1660 = 0.0;
      local_1628 = (ulong)local_1628._4_4_ << 0x20;
      local_1600 = (ulong)local_1600._4_4_ << 0x20;
      if ((long)(int)local_15c8._8_4_ +
          ((long)local_1640.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           CONCAT44(local_1640.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start._4_4_,
                    local_1640.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start._0_4_) >> 2) != 0) {
        iVar6 = 0;
        local_1628 = 0;
        local_1620 = 0;
        uVar17 = 0;
        local_15e8 = lVar7;
        do {
          if (local_1658.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_1658.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start) {
            lVar7 = ggml_time_us();
            gpt2_eval((gpt2_model *)local_1528,local_15f8,iVar6,&local_1658,&local_1618);
            lVar14 = ggml_time_us();
            local_1620 = (local_1620 - lVar7) + lVar14;
          }
          uVar20 = local_15c8._32_4_;
          local_1600 = (long)local_1658.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)local_1658.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start;
          if (local_1600 != 0) {
            local_1658.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_finish = local_1658.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
          }
          lVar7 = CONCAT44(local_1640.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,
                           local_1640.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._0_4_);
          if (uVar17 < (ulong)((long)local_1640.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_finish - lVar7 >> 2)) {
            lVar14 = uVar17 * 4;
            piVar12 = local_1658.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            uVar18 = uVar17;
            do {
              if (local_1658.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_1658.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&local_1658,
                           (iterator)
                           local_1658.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(int *)(lVar7 + lVar14));
                piVar12 = local_1658.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
              }
              else {
                *local_1658.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = *(int *)(lVar7 + lVar14);
                local_1658.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_1658.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              if ((int)local_15c8._16_4_ <=
                  (int)((ulong)((long)local_1658.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_finish - (long)piVar12) >>
                       2)) break;
              uVar18 = uVar18 + 1;
              lVar7 = CONCAT44(local_1640.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start._4_4_,
                               local_1640.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start._0_4_);
              lVar14 = lVar14 + 4;
            } while (uVar18 < (ulong)((long)local_1640.super__Vector_base<int,_std::allocator<int>_>
                                            ._M_impl.super__Vector_impl_data._M_finish - lVar7 >> 2)
                    );
            uVar17 = (uVar17 + ((long)local_1658.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_finish - (long)piVar12 >> 2
                               )) - 1;
          }
          else {
            local_15ec = (float)local_15c8._36_4_;
            local_15f0 = (float)local_15c8._40_4_;
            lVar7 = (long)(int)local_1528._0_4_;
            local_165c = 0;
            local_15d0 = ggml_time_us();
            local_165c = gpt_sample_top_k_top_p
                                   (&local_1430,
                                    local_1618.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start +
                                    (((ulong)((long)local_1618.
                                                                                                        
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                             (long)local_1618.
                                                   super__Vector_base<float,_std::allocator<float>_>
                                                   ._M_impl.super__Vector_impl_data._M_start) >> 2)
                                    - lVar7),uVar20,(double)local_15ec,(double)local_15f0,
                                    &local_13b8);
            lVar7 = ggml_time_us();
            if (local_1658.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_1658.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_1658,
                         (iterator)
                         local_1658.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,&local_165c);
            }
            else {
              *local_1658.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = local_165c;
              local_1658.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_1658.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            local_1628 = (local_1628 - local_15d0) + lVar7;
          }
          piVar2 = local_1658.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          for (piVar19 = local_1658.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start; piVar19 != piVar2; piVar19 = piVar19 + 1)
          {
            local_165c = *piVar19;
            pmVar13 = std::
                      map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](&local_1430.id_to_token,&local_165c);
            printf("%s",(pmVar13->_M_dataplus)._M_p);
          }
          iVar6 = iVar6 + (int)(local_1600 >> 2);
          fflush(_stdout);
        } while ((local_1658.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1] != 0xc450) &&
                (uVar17 = uVar17 + 1,
                uVar17 < (ulong)((long)(int)local_15c8._8_4_ +
                                ((long)local_1640.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                 CONCAT44(local_1640.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start._4_4_,
                                          local_1640.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start._0_4_) >> 2))));
        local_1628 = CONCAT44(local_1628._4_4_,(float)local_1628);
        local_1660 = (float)local_1620;
        local_1600 = CONCAT44(local_1600._4_4_,(float)iVar6);
        lVar7 = local_15e8;
      }
      lVar14 = ggml_time_us();
      local_1620 = CONCAT44(local_1620._4_4_,(float)(local_15d8 - local_15e0));
      puts("\n");
      printf("%s:     load time = %8.2f ms\n",SUB84((double)((float)local_1620 / 1000.0),0),"main");
      printf("%s:   sample time = %8.2f ms\n",SUB84((double)((float)local_1628 / 1000.0),0),"main");
      printf("%s:  predict time = %8.2f ms / %.2f ms per token\n",
             SUB84((double)(local_1660 / 1000.0),0),
             (double)((local_1660 / 1000.0) / (float)local_1600),"main");
      printf("%s:    total time = %8.2f ms\n",SUB84((double)((float)(lVar14 - lVar7) / 1000.0),0),
             "main");
      ggml_free(local_14b8);
      ggml_backend_sched_free(local_15f8);
      ggml_backend_buffer_free(local_1480);
      ppgVar4 = local_1490;
      for (ppgVar15 = ppgStack_1498; ppgVar3 = ppgStack_14a8, ppgVar16 = local_14b0,
          ppgVar15 != ppgVar4; ppgVar15 = ppgVar15 + 1) {
        ggml_backend_buffer_free(*ppgVar15);
      }
      for (; ppgVar16 != ppgVar3; ppgVar16 = ppgVar16 + 1) {
        ggml_backend_free(*ppgVar16);
      }
      if (local_1658.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (id *)0x0) {
        operator_delete(local_1658.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1658.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1658.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      pvVar1 = (void *)CONCAT44(local_1640.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                local_1640.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._0_4_);
      if (pvVar1 != (void *)0x0) {
        operator_delete(pvVar1,(long)local_1640.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pvVar1);
      }
      if (local_1618.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1618.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1618.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1618.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      iVar6 = 0;
    }
    else {
      main_cold_1();
      iVar6 = 1;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
    ::~_Rb_tree(&local_1470);
    if (ppgStack_1498 != (pointer)0x0) {
      operator_delete(ppgStack_1498,(long)ppgStack_1488 - (long)ppgStack_1498);
    }
    if (local_14b0 != (pointer)0x0) {
      operator_delete(local_14b0,(long)local_14a0 - (long)local_14b0);
    }
    if (local_14e0 != (pointer)0x0) {
      operator_delete(local_14e0,(long)local_14d0 - (long)local_14e0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1430.special_tokens);
    std::
    _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_1430.id_to_token._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 *)&local_1430);
  }
  if (local_1550._M_dataplus._M_p != local_15c8 + 0x88) {
    operator_delete(local_1550._M_dataplus._M_p,local_1550.field_2._M_allocated_capacity + 1);
  }
  if (local_1570._M_dataplus._M_p != local_15c8 + 0x68) {
    operator_delete(local_1570._M_dataplus._M_p,local_1570.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_15c8._56_8_ != local_15c8 + 0x48) {
    operator_delete((void *)local_15c8._56_8_,local_15c8._72_8_ + 1);
  }
  return iVar6;
}

Assistant:

int main(int argc, char ** argv) {
    ggml_time_init();

    const int64_t t_main_start_us = ggml_time_us();

    gpt_params params;
    params.model = "models/gpt-2-117M/ggml-model.bin";

    if (gpt_params_parse(argc, argv, params) == false) {
        return 1;
    }

    if (params.seed < 0) {
        params.seed = time(NULL);
    }

    printf("%s: seed = %d\n", __func__, params.seed);

    std::mt19937 rng(params.seed);
    if (params.prompt.empty()) {
        params.prompt = gpt_random_prompt(rng);
    }

    int64_t t_load_us = 0;

    gpt_vocab vocab;
    gpt2_model model;

    // load the model
    {
        const int64_t t_start_us = ggml_time_us();

        if (!gpt2_model_load(params.model, model, vocab, params)) {
            fprintf(stderr, "%s: failed to load model from '%s'\n", __func__, params.model.c_str());
            return 1;
        }

        t_load_us = ggml_time_us() - t_start_us;

        test_gpt_tokenizer(vocab, params.token_test);
    }

    // create the backend scheduler
    // the scheduler handles the allocation of the compute buffers and the scheduling of the computation between the different backends
    ggml_backend_sched_t sched;
    {
        // initialize the scheduler
        sched = ggml_backend_sched_new(model.backends.data(), NULL, model.backends.size(), GPT2_MAX_NODES, false);

        // create the worst case graph for memory usage estimation
        int n_tokens = std::min(model.hparams.n_ctx, params.n_batch);
        int n_past = model.hparams.n_ctx - n_tokens;
        struct ggml_cgraph * gf = gpt2_graph(model, n_past, std::vector<gpt_vocab::id>(n_tokens, 0));

        ggml_backend_sched_reserve(sched, gf);


        // compute the required memory
        size_t mem_size = 0;
        for (size_t i = 0; i < model.backends.size(); i++) {
            size_t size = ggml_backend_sched_get_buffer_size(sched, model.backends[i]);
            if (size > 0) {
                mem_size += size;
                printf("%s: %8s compute buffer size = %8.2f MB\n", __func__, ggml_backend_name(model.backends[i]), size/1024.0/1024.0);
                //printf("%s: %8s compute buffer size = %zu bytes\n", __func__, ggml_backend_name(model.backends[i]), size);
            }
        }

        printf("%s: total compute buffer size: %.2f MB\n", __func__, mem_size/1024.0/1024.0);
    }

    int n_past = 0;

    int64_t t_sample_us  = 0;
    int64_t t_predict_us = 0;

    std::vector<float> logits;

    // tokenize the prompt
    std::vector<gpt_vocab::id> embd_inp = ::gpt_tokenize(vocab, params.prompt);

    params.n_predict = std::min(params.n_predict, model.hparams.n_ctx - (int) embd_inp.size());

    printf("%s: prompt: '%s'\n", __func__, params.prompt.c_str());
    printf("%s: number of tokens in prompt = %zu, first 8 tokens: ", __func__, embd_inp.size());
    for (int i = 0; i < std::min(8, (int) embd_inp.size()); i++) {
        printf("%d ", embd_inp[i]);
    }
    printf("\n\n");

    // submit the input prompt token-by-token
    // this reduces the memory usage during inference, at the cost of a bit of speed at the beginning
    std::vector<gpt_vocab::id> embd;

    for (size_t i = embd.size(); i < embd_inp.size() + params.n_predict; i++) {
        // predict
        if (embd.size() > 0) {
            const int64_t t_start_us = ggml_time_us();

            if (!gpt2_eval(model, sched, n_past, embd, logits)) {
                printf("Failed to predict\n");
                return 1;
            }

            t_predict_us += ggml_time_us() - t_start_us;
        }

        n_past += embd.size();
        embd.clear();

        if (i >= embd_inp.size()) {
            // sample next token
            const int   top_k = params.top_k;
            const float top_p = params.top_p;
            const float temp  = params.temp;

            const int n_vocab = model.hparams.n_vocab;

            gpt_vocab::id id = 0;

            {
                const int64_t t_start_sample_us = ggml_time_us();

                id = gpt_sample_top_k_top_p(vocab, logits.data() + (logits.size() - n_vocab), top_k, top_p, temp, rng);

                t_sample_us += ggml_time_us() - t_start_sample_us;
            }

            // add it to the context
            embd.push_back(id);
        } else {
            // if here, it means we are still processing the input prompt
            for (size_t k = i; k < embd_inp.size(); k++) {
                embd.push_back(embd_inp[k]);
                if (int32_t(embd.size()) >= params.n_batch) {
                    break;
                }
            }
            i += embd.size() - 1;
        }

        // display text
        for (auto id : embd) {
            printf("%s", vocab.id_to_token[id].c_str());
        }
        fflush(stdout);

        // end of text token
        if (embd.back() == 50256) {
            break;
        }
    }

    // report timing
    {
        const int64_t t_main_end_us = ggml_time_us();

        printf("\n\n");
        printf("%s:     load time = %8.2f ms\n", __func__, t_load_us/1000.0f);
        printf("%s:   sample time = %8.2f ms\n", __func__, t_sample_us/1000.0f);
        printf("%s:  predict time = %8.2f ms / %.2f ms per token\n", __func__, t_predict_us/1000.0f, t_predict_us/1000.0f/n_past);
        printf("%s:    total time = %8.2f ms\n", __func__, (t_main_end_us - t_main_start_us)/1000.0f);
    }

    ggml_free(model.ctx_w);

    ggml_backend_sched_free(sched);
    ggml_backend_buffer_free(model.buffer_kv);
    for (auto buf : model.buffers_w) {
        ggml_backend_buffer_free(buf);
    }
    for (auto backend : model.backends) {
        ggml_backend_free(backend);
    }

    return 0;
}